

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::CollectiveDipoleDisplacement::calcCorrVal
          (Vector3d *__return_storage_ptr__,CollectiveDipoleDisplacement *this,int frame1,int frame2
          )

{
  pointer pVVar1;
  uint i;
  long lVar2;
  double tmp;
  double dVar3;
  double tmp_1;
  double dVar4;
  double tmp_2;
  double dVar5;
  Vector<double,_3U> result;
  double local_18 [3];
  
  pVVar1 = (this->CRcm_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result.data_[lVar2] =
         pVVar1[frame2].super_Vector<double,_3U>.data_[lVar2] -
         pVVar1[frame1].super_Vector<double,_3U>.data_[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = result.data_[2];
  local_18[0] = result.data_[0];
  local_18[1] = result.data_[1];
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + local_18[lVar2] * local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pVVar1 = (this->CRtot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result.data_[lVar2] =
         pVVar1[frame2].super_Vector<double,_3U>.data_[lVar2] -
         pVVar1[frame1].super_Vector<double,_3U>.data_[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = result.data_[2];
  local_18[0] = result.data_[0];
  local_18[1] = result.data_[1];
  dVar4 = 0.0;
  lVar2 = 0;
  do {
    dVar4 = dVar4 + local_18[lVar2] * local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pVVar1 = (this->CRrot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar2 = 0;
  do {
    result.data_[lVar2] =
         pVVar1[frame2].super_Vector<double,_3U>.data_[lVar2] -
         pVVar1[frame1].super_Vector<double,_3U>.data_[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = result.data_[2];
  local_18[0] = result.data_[0];
  local_18[1] = result.data_[1];
  dVar5 = 0.0;
  lVar2 = 0;
  do {
    dVar5 = dVar5 + local_18[lVar2] * local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = dVar3;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar4;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = dVar5;
  return __return_storage_ptr__;
}

Assistant:

Vector3d CollectiveDipoleDisplacement::calcCorrVal(int frame1, int frame2) {
    Vector3d diff;
    RealType dcm, dtot, drot;
    diff = CRcm_[frame2] - CRcm_[frame1];
    dcm  = diff.lengthSquare();
    diff = CRtot_[frame2] - CRtot_[frame1];
    dtot = diff.lengthSquare();
    diff = CRrot_[frame2] - CRrot_[frame1];
    drot = diff.lengthSquare();

    return Vector3d(dcm, dtot, drot);
  }